

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

void soundfiler_read(t_soundfiler *x,t_symbol *s,int argc,t_atom *argv)

{
  float fVar1;
  char cVar2;
  uint uVar3;
  t_word *ptVar4;
  byte bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  _garray *p_Var14;
  _binbuf *b;
  int *piVar15;
  ssize_t sVar16;
  t_atom *ptVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  uint uVar22;
  char *pcVar23;
  ulong uVar24;
  t_word **vec;
  char *pcVar25;
  ulong uVar26;
  uint *puVar27;
  ulong uVar28;
  uint *puVar29;
  ulong uVar30;
  long lVar31;
  t_atom *a;
  long lVar32;
  bool bVar33;
  t_float tVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int vecsize_3;
  int vecsize_2;
  t_word *vecs [64];
  _garray *garrays [64];
  char sampbuf [1024];
  t_soundfile_type *local_8c0;
  ulong local_890;
  t_soundfile local_888;
  int local_84c;
  ulong local_848;
  undefined8 local_840;
  t_word *local_838 [64];
  undefined8 auStack_638 [64];
  uint local_438 [258];
  
  local_888.sf_type = (t_soundfile_type *)0x0;
  local_888.sf_bigendian = 0;
  local_888.sf_bytesperframe = 0;
  local_888.sf_samplerate = 0;
  local_888.sf_nchannels = 0;
  local_888._24_8_ = 0;
  local_888.sf_fd = -1;
  local_888._4_4_ = 0;
  local_888.sf_bytelimit = 0x7fffffffffffffff;
  local_888.sf_headersize = -1;
  bVar5 = 1;
  if (argc < 1) {
    local_848 = 0xffffffffffffffff;
    bVar6 = false;
    bVar21 = false;
    local_890 = 0;
LAB_00129a08:
    local_888.sf_type = (t_soundfile_type *)0x0;
    local_8c0 = (t_soundfile_type *)0x0;
    iVar13 = 0;
  }
  else {
    local_848 = 0xffffffffffffffff;
    local_8c0 = (t_soundfile_type *)0x0;
    bVar6 = false;
    iVar13 = 0;
    bVar21 = false;
    local_890 = 0;
    lVar32 = -1;
    do {
      if ((argv->a_type != A_SYMBOL) || (pcVar23 = ((argv->a_w).w_symbol)->s_name, *pcVar23 != '-'))
      break;
      pcVar23 = pcVar23 + 1;
      pcVar25 = "skip";
      iVar10 = strcmp(pcVar23,"skip");
      if (iVar10 == 0) {
        if (((argc == 1) || (argv[1].a_type != A_FLOAT)) ||
           (fVar1 = argv[1].a_w.w_float, fVar1 < 0.0)) goto LAB_00129b91;
        local_890 = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
        lVar31 = 0x20;
        iVar10 = -2;
      }
      else {
        pcVar25 = "ascii";
        iVar10 = strcmp(pcVar23,"ascii");
        if (iVar10 == 0) {
          iVar13 = 1;
          lVar31 = 0x10;
          iVar10 = -1;
          if (-1 < lVar32) {
            post("\'-ascii\' overridden by \'-raw\'");
          }
        }
        else {
          pcVar25 = "raw";
          iVar10 = strcmp(pcVar23,"raw");
          if (iVar10 == 0) {
            if (iVar13 == 0) {
              if (local_8c0 != (t_soundfile_type *)0x0) {
                pcVar25 = local_8c0->t_name;
                post("\'-%s\' overridden by \'-raw\'");
              }
            }
            else {
              post("\'-ascii\' overridden by \'-raw\'");
            }
            if (((((uint)argc < 5) || (argv[1].a_type != A_FLOAT)) ||
                ((lVar32 = (long)argv[1].a_w.w_float, local_888.sf_headersize = lVar32, lVar32 < 0
                 || ((argv[2].a_type != A_FLOAT ||
                     (uVar22 = (uint)argv[2].a_w.w_float, local_888.sf_nchannels = uVar22,
                     uVar22 - 0x41 < 0xffffffc0)))))) || (argv[3].a_type != A_FLOAT))
            goto LAB_00129b91;
            iVar10 = (int)argv[3].a_w.w_float;
            local_888.sf_bytespersample = iVar10;
            if ((iVar10 - 5U < 0xfffffffd) || (argv[4].a_type != A_SYMBOL)) goto LAB_00129b91;
            cVar2 = *(argv[4].a_w.w_symbol)->s_name;
            bVar21 = true;
            iVar12 = 1;
            if (cVar2 != 'b') {
              if ((cVar2 != 'n') && (cVar2 != 'l')) goto LAB_00129b91;
              iVar12 = 0;
            }
            local_888.sf_bigendian = iVar12;
            tVar34 = sys_getsr();
            local_888.sf_samplerate = (int)tVar34;
            local_888.sf_bytesperframe = iVar10 * uVar22;
            lVar31 = 0x50;
            iVar10 = -5;
          }
          else {
            pcVar25 = "resize";
            iVar11 = strcmp(pcVar23,"resize");
            lVar31 = 0x10;
            iVar10 = -1;
            iVar12 = -1;
            if (iVar11 != 0) {
              pcVar25 = "maxsize";
              iVar12 = strcmp(pcVar23,"maxsize");
              if (iVar12 != 0) {
                local_8c0 = soundfile_findtype(pcVar23);
                local_888.sf_type = local_8c0;
                if (local_8c0 != (t_soundfile_type *)0x0) {
                  if (lVar32 < 0) {
                    iVar13 = 0;
                  }
                  else {
                    pcVar25 = local_8c0->t_name;
                    iVar13 = 0;
                    post("\'-%s\' overridden by \'-raw\'");
                  }
                  goto LAB_001299bb;
                }
                goto LAB_00129b91;
              }
              if (((argc == 1) || (argv[1].a_type != A_FLOAT)) ||
                 (local_848 = (ulong)argv[1].a_w.w_float, (long)local_848 < 0)) goto LAB_00129b91;
              lVar31 = 0x20;
              iVar12 = -2;
            }
            iVar10 = iVar12;
            bVar6 = true;
          }
        }
      }
LAB_001299bb:
      argv = (t_atom *)((long)&argv->a_type + lVar31);
      bVar33 = SCARRY4(argc,iVar10);
      argc = argc + iVar10;
      s = (t_symbol *)pcVar25;
    } while (argc != 0 && bVar33 == argc < 0);
    if (-1 < lVar32) {
      bVar5 = 0;
      goto LAB_00129a08;
    }
  }
  if ((argc - 0x42U < 0xffffffbf) || (argv->a_type != A_SYMBOL)) {
LAB_00129b91:
    uVar24 = 0;
    pd_error(x,"usage: read [flags] filename [tablename]...");
    post("flags: -skip <n> -resize -maxsize <n> %s -ascii ...",sf_typeargs);
    post("-raw <headerbytes> <channels> <bytespersample> <endian (b, l, or n)>");
  }
  else {
    pcVar23 = ((argv->a_w).w_symbol)->s_name;
    if ((bool)(bVar5 & (local_8c0 == (t_soundfile_type *)0x0 && iVar13 == 0))) {
      iVar13 = ascii_hasextension(pcVar23,(size_t)s);
    }
    uVar22 = argc - 1;
    if ((uint)argc < 2) {
      if (iVar13 == 0) {
        uVar24 = 0;
        goto LAB_00129c7c;
      }
LAB_00129c32:
      uVar24 = 0;
      pd_error(x,"soundfiler read: \'-ascii\' requires at least one table");
    }
    else {
      lVar32 = 0;
      uVar24 = 0;
      do {
        if (*(int *)((long)&argv[1].a_type + lVar32 * 2) != 2) goto LAB_00129b91;
        p_Var14 = (_garray *)
                  pd_findbyclass(*(t_symbol **)((long)&argv[1].a_w + lVar32 * 2),garray_class);
        *(_garray **)((long)auStack_638 + lVar32) = p_Var14;
        if (p_Var14 == (_garray *)0x0) {
          uVar24 = 0;
          pd_error(x,"soundfiler read: %s: no such table",
                   **(undefined8 **)((long)&argv[1].a_w + lVar32 * 2));
          goto LAB_00129bcd;
        }
        iVar10 = garray_getfloatwords
                           (p_Var14,(int *)local_438,(t_word **)((long)local_838 + lVar32));
        if (iVar10 == 0) {
          pd_error(x,"soundfiler read: %s: bad template for tabwrite",
                   **(undefined8 **)((long)&argv[1].a_w + lVar32 * 2));
        }
        if (((uVar24 != 0) && (uVar24 != (long)(int)local_438[0])) && (!bVar6)) {
          post("arrays have different lengths, resizing...");
          bVar6 = true;
        }
        uVar19 = local_438[0];
        uVar24 = (ulong)(int)local_438[0];
        lVar32 = lVar32 + 8;
      } while ((ulong)uVar22 << 3 != lVar32);
      if (iVar13 == 0) {
LAB_00129c7c:
        iVar13 = open_soundfile_via_canvas(x->x_canvas,pcVar23,&local_888,local_890);
        uVar30 = local_848;
        if (-1 < iVar13) {
          uVar20 = local_888.sf_bytelimit / (long)local_888.sf_bytesperframe;
          if (bVar6) {
            uVar24 = uVar20;
            if (local_848 < uVar20) {
              pd_error(x,"soundfiler read: truncated to %ld elements",local_848);
              uVar24 = uVar30;
            }
            uVar20 = uVar24;
            if (1 < (uint)argc) {
              lVar32 = 0;
              do {
                p_Var14 = *(_garray **)((long)auStack_638 + lVar32);
                garray_resize_long(p_Var14,uVar24);
                garray_setsaveit(p_Var14,0);
                iVar10 = garray_getfloatwords
                                   (p_Var14,(int *)local_438,(t_word **)((long)local_838 + lVar32));
                if ((iVar10 == 0) || (uVar24 != (long)(int)local_438[0])) {
                  uVar24 = 0;
                  pd_error(x,"soundfiler read: resize failed");
                  goto LAB_0012a272;
                }
                lVar32 = lVar32 + 8;
              } while ((ulong)uVar22 << 3 != lVar32);
            }
          }
          uVar24 = -(ulong)(uVar24 == 0) | uVar24;
          uVar30 = uVar20;
          if (uVar24 < uVar20) {
            uVar30 = uVar24;
          }
          if ((long)uVar20 < 0) {
            uVar30 = uVar24;
          }
          if ((uVar22 != 0 || bVar21) || (uVar24 = uVar30, uVar30 == 0xffffffffffffffff)) {
            uVar24 = 0;
            if (uVar30 != 0) {
              uVar20 = (ulong)(int)(0x400 / (long)local_888.sf_bytesperframe);
              uVar24 = 0;
              do {
                uVar26 = uVar30 - uVar24;
                if (uVar20 <= uVar30 - uVar24) {
                  uVar26 = uVar20;
                }
                sVar16 = read(local_888.sf_fd,local_438,(long)local_888.sf_bytesperframe * uVar26);
                auVar9 = _DAT_001b53a0;
                auVar8 = _DAT_001b5390;
                auVar7 = _DAT_001b5380;
                lVar32 = sVar16 / (long)local_888.sf_bytesperframe;
                if (lVar32 < 1) break;
                uVar19 = uVar22;
                if (local_888.sf_nchannels < (int)uVar22) {
                  uVar19 = local_888.sf_nchannels;
                }
                if (0 < (int)uVar19) {
                  uVar28 = local_888._24_8_ & 0xffffffff;
                  uVar26 = 0;
                  puVar27 = local_438;
                  do {
                    iVar10 = (int)uVar28;
                    if (iVar10 == 4) {
                      ptVar4 = local_838[uVar26];
                      if (local_888.sf_bigendian == 0) {
                        lVar31 = 0;
                        puVar29 = puVar27;
                        do {
                          ptVar4[uVar24 + lVar31].w_index = *puVar29;
                          lVar31 = lVar31 + 1;
                          puVar29 = (uint *)((long)puVar29 + (long)local_888.sf_bytesperframe);
                        } while (lVar32 != lVar31);
                      }
                      else {
                        lVar31 = 0;
                        puVar29 = puVar27;
                        do {
                          uVar3 = *puVar29;
                          ptVar4[uVar24 + lVar31].w_index =
                               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18;
                          lVar31 = lVar31 + 1;
                          puVar29 = (uint *)((long)puVar29 + (long)local_888.sf_bytesperframe);
                        } while (lVar32 != lVar31);
                      }
                    }
                    else if (iVar10 == 3) {
                      ptVar4 = local_838[uVar26];
                      if (local_888.sf_bigendian == 0) {
                        lVar31 = 0;
                        puVar29 = puVar27;
                        do {
                          ptVar4[uVar24 + lVar31].w_float =
                               (float)(int)((uint)(byte)*puVar29 << 8 |
                                           (uint)*(ushort *)((long)puVar29 + 1) << 0x10) *
                               4.656613e-10;
                          lVar31 = lVar31 + 1;
                          puVar29 = (uint *)((long)puVar29 + (long)local_888.sf_bytesperframe);
                        } while (lVar32 != lVar31);
                      }
                      else {
                        lVar31 = 0;
                        puVar29 = puVar27;
                        do {
                          ptVar4[uVar24 + lVar31].w_float =
                               (float)(int)((uint)*(byte *)((long)puVar29 + 2) << 8 |
                                           (uint)*(byte *)((long)puVar29 + 1) << 0x10 |
                                           (uint)(byte)*puVar29 << 0x18) * 4.656613e-10;
                          lVar31 = lVar31 + 1;
                          puVar29 = (uint *)((long)puVar29 + (long)local_888.sf_bytesperframe);
                        } while (lVar32 != lVar31);
                      }
                    }
                    else if (iVar10 == 2) {
                      ptVar4 = local_838[uVar26];
                      if (local_888.sf_bigendian == 0) {
                        lVar31 = 0;
                        puVar29 = puVar27;
                        do {
                          ptVar4[uVar24 + lVar31].w_float =
                               (float)(int)((uint)(ushort)*puVar29 << 0x10) * 4.656613e-10;
                          lVar31 = lVar31 + 1;
                          puVar29 = (uint *)((long)puVar29 + (long)local_888.sf_bytesperframe);
                        } while (lVar32 != lVar31);
                      }
                      else {
                        lVar31 = 0;
                        puVar29 = puVar27;
                        do {
                          ptVar4[uVar24 + lVar31].w_float =
                               (float)(int)((uint)*(byte *)((long)puVar29 + 1) << 0x10 |
                                           (uint)(byte)*puVar29 << 0x18) * 4.656613e-10;
                          lVar31 = lVar31 + 1;
                          puVar29 = (uint *)((long)puVar29 + (long)local_888.sf_bytesperframe);
                        } while (lVar32 != lVar31);
                      }
                    }
                    uVar26 = uVar26 + 1;
                    uVar28 = (ulong)local_888.sf_bytespersample;
                    puVar27 = (uint *)((long)puVar27 + uVar28);
                  } while (uVar26 != uVar19);
                }
                if (local_888.sf_nchannels < (int)uVar22) {
                  lVar18 = (long)local_888.sf_nchannels;
                  lVar31 = lVar32 + -1;
                  auVar35._8_4_ = (int)lVar31;
                  auVar35._0_8_ = lVar31;
                  auVar35._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  auVar35 = auVar35 ^ auVar9;
                  do {
                    ptVar4 = local_838[lVar18];
                    uVar26 = 0;
                    do {
                      auVar36._8_4_ = (int)uVar26;
                      auVar36._0_8_ = uVar26;
                      auVar36._12_4_ = (int)(uVar26 >> 0x20);
                      auVar37 = (auVar36 | auVar8) ^ auVar9;
                      iVar10 = auVar35._4_4_;
                      if ((bool)(~(iVar10 < auVar37._4_4_ ||
                                  auVar35._0_4_ < auVar37._0_4_ && auVar37._4_4_ == iVar10) & 1)) {
                        ptVar4[uVar26].w_float = 0.0;
                      }
                      if (auVar37._12_4_ <= auVar35._12_4_ &&
                          (auVar37._8_4_ <= auVar35._8_4_ || auVar37._12_4_ != auVar35._12_4_)) {
                        ptVar4[uVar26 + 1].w_float = 0.0;
                      }
                      auVar36 = (auVar36 | auVar7) ^ auVar9;
                      iVar12 = auVar36._4_4_;
                      if (iVar12 <= iVar10 && (iVar12 != iVar10 || auVar36._0_4_ <= auVar35._0_4_))
                      {
                        ptVar4[uVar26 + 2].w_float = 0.0;
                        ptVar4[uVar26 + 3].w_float = 0.0;
                      }
                      uVar26 = uVar26 + 4;
                    } while ((lVar32 + 3U & 0xfffffffffffffffc) != uVar26);
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != (int)uVar22);
                }
                uVar24 = uVar24 + lVar32;
              } while (uVar24 < uVar30);
            }
            if ((bVar6) && (uVar24 < uVar30)) {
              post("warning: soundfile %s header promised %ld points but file was truncated to %ld",
                   pcVar23,uVar30,uVar24);
            }
            if (1 < (uint)argc) {
              uVar30 = 0;
              do {
                iVar10 = garray_getfloatwords
                                   ((_garray *)auStack_638[uVar30],(int *)&local_840,
                                    local_838 + uVar30);
                if ((iVar10 != 0) && (uVar20 = uVar24, uVar24 < (ulong)(long)(int)local_840)) {
                  do {
                    local_838[uVar30][uVar20].w_float = 0.0;
                    uVar20 = uVar20 + 1;
                  } while (uVar20 < (ulong)(long)(int)local_840);
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar22);
            }
            lVar32 = (long)local_888.sf_nchannels;
            if (local_888.sf_nchannels < (int)uVar22) {
              do {
                iVar10 = garray_getfloatwords
                                   ((_garray *)auStack_638[lVar32],&local_84c,(t_word **)&local_840)
                ;
                if ((iVar10 != 0) && (local_84c != 0)) {
                  uVar30 = 0;
                  do {
                    *(undefined4 *)(CONCAT44(local_840._4_4_,(int)local_840) + uVar30 * 8) = 0;
                    uVar30 = uVar30 + 1;
                  } while (uVar30 < (ulong)(long)local_84c);
                }
                lVar32 = lVar32 + 1;
              } while (uVar22 != (uint)lVar32);
            }
            if (1 < (uint)argc) {
              uVar30 = 0;
              do {
                garray_redraw((_garray *)auStack_638[uVar30]);
                uVar30 = uVar30 + 1;
              } while (uVar22 != uVar30);
            }
          }
LAB_0012a272:
          local_888.sf_fd = -1;
          sys_close(iVar13);
          goto LAB_00129bd5;
        }
        piVar15 = __errno_location();
        object_sferror(x,"soundfiler read",pcVar23,*piVar15,&local_888);
      }
      else {
        if (uVar22 == 0) goto LAB_00129c32;
        b = binbuf_new();
        iVar13 = binbuf_read_via_canvas(b,pcVar23,x->x_canvas,0);
        if (iVar13 == 0) {
          ptVar17 = binbuf_getvec(b);
          iVar13 = binbuf_getnatom(b);
          uVar30 = local_848;
          iVar13 = iVar13 / (int)uVar22;
          if (0 < iVar13) {
            uVar20 = (ulong)iVar13;
            if (bVar6) {
              if (local_848 < uVar20) {
                pd_error(x,"soundfiler read: truncated to %ld elements",local_848);
                uVar20 = uVar30;
              }
              uVar20 = uVar20 - local_890;
              if (1 < (uint)argc) {
                vec = local_838;
                lVar32 = 0;
                do {
                  p_Var14 = (_garray *)auStack_638[lVar32];
                  garray_resize_long(p_Var14,uVar20);
                  garray_setsaveit(p_Var14,0);
                  iVar13 = garray_getfloatwords(p_Var14,(int *)local_438,vec);
                  if ((iVar13 == 0) || (uVar20 != (long)(int)local_438[0])) {
                    pd_error(x,"soundfiler read: resize failed");
                    goto LAB_00129b84;
                  }
                  lVar32 = lVar32 + 1;
                  vec = vec + 1;
                } while ((int)uVar22 != lVar32);
              }
            }
            else {
              uVar20 = uVar20 - local_890;
              if ((int)uVar19 <= iVar13) {
                uVar20 = uVar24;
              }
            }
            if (0 < (long)uVar20) {
              uVar30 = 0;
              uVar24 = local_890 * (long)(int)uVar22;
              if ((long)local_890 < 1) {
                uVar24 = uVar30;
              }
              ptVar17 = ptVar17 + uVar24;
              do {
                if (1 < (uint)argc) {
                  lVar32 = 0;
                  a = ptVar17;
                  do {
                    ptVar17 = a + 1;
                    tVar34 = atom_getfloat(a);
                    local_838[lVar32][uVar30].w_float = tVar34;
                    lVar32 = lVar32 + 1;
                    a = ptVar17;
                  } while ((int)uVar22 != lVar32);
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar20);
            }
            iVar13 = (int)uVar20;
            if (1 < (uint)argc) {
              lVar32 = 0;
              do {
                iVar10 = garray_getfloatwords
                                   ((_garray *)auStack_638[lVar32],(int *)local_438,
                                    local_838 + lVar32);
                if ((iVar10 != 0) && (lVar31 = (long)iVar13, iVar13 < (int)local_438[0])) {
                  do {
                    local_838[lVar32][lVar31].w_float = 0.0;
                    lVar31 = lVar31 + 1;
                  } while (lVar31 < (int)local_438[0]);
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 != (int)uVar22);
              lVar32 = 0;
              do {
                garray_redraw((_garray *)auStack_638[lVar32]);
                lVar32 = lVar32 + 1;
              } while ((int)uVar22 != lVar32);
            }
            binbuf_free(b);
            if (iVar13 == 0) {
              uVar24 = 0;
            }
            else {
              uVar24 = (ulong)iVar13;
              tVar34 = sys_getsr();
              local_888.sf_samplerate = (int)tVar34;
              local_888.sf_headersize = 0;
              local_888.sf_bytespersample = 4;
              local_888._40_8_ = local_888._40_8_ & 0xffffffff00000000;
              local_888.sf_nchannels = uVar22;
            }
            goto LAB_00129bcd;
          }
          pd_error(x,"soundfiler read: %s: empty or very short ascii file",pcVar23);
        }
LAB_00129b84:
        binbuf_free(b);
      }
      uVar24 = 0;
    }
  }
LAB_00129bcd:
  local_888.sf_fd = -1;
LAB_00129bd5:
  outlet_soundfileinfo(x->x_out2,&local_888);
  outlet_float((x->x_obj).te_outlet,(float)uVar24);
  return;
}

Assistant:

static void soundfiler_read(t_soundfiler *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_soundfile sf = {0};
    int fd = -1, resize = 0, ascii = 0, raw = 0, i;
    size_t skipframes = 0, finalsize = 0, maxsize = SFMAXFRAMES,
           framesread = 0, bufframes, j;
    ssize_t nframes, framesinfile;
    char endianness;
    const char *filename;
    t_garray *garrays[MAXSFCHANS];
    t_word *vecs[MAXSFCHANS];
    char sampbuf[SAMPBUFSIZE];

    soundfile_clear(&sf);
    sf.sf_headersize = -1;
    while (argc > 0 && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        const char *flag = argv->a_w.w_symbol->s_name + 1;
        if (!strcmp(flag, "skip"))
        {
            if (argc < 2 || argv[1].a_type != A_FLOAT ||
                (argv[1].a_w.w_float) < 0)
                    goto usage;
            skipframes = argv[1].a_w.w_float;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(flag, "ascii"))
        {
            if (sf.sf_headersize >= 0)
                post("'-ascii' overridden by '-raw'");
            ascii = 1;
            argc--; argv++;
        }
        else if (!strcmp(flag, "raw"))
        {
            if (ascii)
                post("'-ascii' overridden by '-raw'");
            else if (sf.sf_type)
                post("'-%s' overridden by '-raw'", sf.sf_type->t_name);
            if (argc < 5 ||
                argv[1].a_type != A_FLOAT ||
                ((sf.sf_headersize = argv[1].a_w.w_float) < 0) ||
                argv[2].a_type != A_FLOAT ||
                ((sf.sf_nchannels = argv[2].a_w.w_float) < 1) ||
                (sf.sf_nchannels > MAXSFCHANS) ||
                argv[3].a_type != A_FLOAT ||
                ((sf.sf_bytespersample = argv[3].a_w.w_float) < 2) ||
                    (sf.sf_bytespersample > 4) ||
                argv[4].a_type != A_SYMBOL ||
                    ((endianness = argv[4].a_w.w_symbol->s_name[0]) != 'b'
                    && endianness != 'l' && endianness != 'n'))
                        goto usage;
            if (endianness == 'b')
                sf.sf_bigendian = 1;
            else if (endianness == 'l')
                sf.sf_bigendian = 0;
            else
                sf.sf_bigendian = sys_isbigendian();
            sf.sf_samplerate = sys_getsr();
            sf.sf_bytesperframe = sf.sf_nchannels * sf.sf_bytespersample;
            raw = 1;
            argc -= 5; argv += 5;
        }
        else if (!strcmp(flag, "resize"))
        {
            resize = 1;
            argc -= 1; argv += 1;
        }
        else if (!strcmp(flag, "maxsize"))
        {
            ssize_t tmp;
            if (argc < 2 || argv[1].a_type != A_FLOAT ||
                ((tmp = (argv[1].a_w.w_float > SFMAXFRAMES ?
                SFMAXFRAMES : argv[1].a_w.w_float)) < 0))
                    goto usage;
            maxsize = (size_t)tmp;
            resize = 1;     /* maxsize implies resize */
            argc -= 2; argv += 2;
        }
        else
        {
                /* check for type by name */
            if (!(sf.sf_type = soundfile_findtype(flag)))
                goto usage; /* unknown flag */
            ascii = 0; /* replaced */
            if (sf.sf_headersize >= 0)
                post("'-%s' overridden by '-raw'", sf.sf_type->t_name);
            argc -= 1; argv += 1;
        }
    }
    if (sf.sf_headersize >= 0)
    {
        ascii = 0;
        sf.sf_type = NULL;
    }
    if (argc < 1 ||                           /* no filename or tables */
        argc > MAXSFCHANS + 1 ||              /* too many tables */
        argv[0].a_type != A_SYMBOL)           /* bad filename */
            goto usage;
    filename = argv[0].a_w.w_symbol->s_name;
    argc--; argv++;

        /* check for implicit ascii */
    if (!ascii && !sf.sf_type && sf.sf_headersize < 0)
        ascii = ascii_hasextension(filename, MAXPDSTRING);

    for (i = 0; i < argc; i++)
    {
        int vecsize;
        if (argv[i].a_type != A_SYMBOL)
            goto usage;
        if (!(garrays[i] =
            (t_garray *)pd_findbyclass(argv[i].a_w.w_symbol, garray_class)))
        {
            pd_error(x, "soundfiler read: %s: no such table",
                argv[i].a_w.w_symbol->s_name);
            goto done;
        }
        else if (!garray_getfloatwords(garrays[i], &vecsize,
                &vecs[i]))
            pd_error(x, "soundfiler read: %s: bad template for tabwrite",
                argv[i].a_w.w_symbol->s_name);
        if (finalsize && finalsize != (size_t)vecsize && !resize)
        {
            post("arrays have different lengths, resizing...");
            resize = 1;
        }
        finalsize = vecsize;
    }
    if (ascii)
    {
        t_asciiargs a =
            {skipframes, finalsize, argc, vecs, garrays, resize, maxsize, 0};
        if (!argc)
        {
            pd_error(x, "soundfiler read: "
                        "'-ascii' requires at least one table");
            goto done;
        }
        if ((framesread = soundfiler_readascii(x, filename, &a)) == 0)
            goto done;
            /* fill in for info outlet */
        sf.sf_samplerate = sys_getsr();
        sf.sf_headersize = 0;
        sf.sf_nchannels = argc;
        sf.sf_bytespersample = 4;
        sf.sf_bigendian = sys_isbigendian();
        goto done;
    }

    fd = open_soundfile_via_canvas(x->x_canvas, filename, &sf, skipframes);
    if (fd < 0)
    {
        object_sferror(x, "soundfiler read", filename, errno, &sf);
        goto done;
    }
    framesinfile = sf.sf_bytelimit / sf.sf_bytesperframe;

    if (resize)
    {
            /* figure out what to resize to using header info */
        if ((size_t)framesinfile > maxsize)
        {
            pd_error(x, "soundfiler read: truncated to %ld elements",
                (long)maxsize);
            framesinfile = maxsize;
        }
        finalsize = framesinfile;
        for (i = 0; i < argc; i++)
        {
            int vecsize;
            garray_resize_long(garrays[i], finalsize);
                /* for sanity's sake let's clear the save-in-patch flag here */
            garray_setsaveit(garrays[i], 0);
            if (!garray_getfloatwords(garrays[i], &vecsize, &vecs[i])
                /* if the resize failed, garray_resize reported the error */
                || (vecsize != framesinfile))
            {
                pd_error(x, "soundfiler read: resize failed");
                goto done;
            }
        }
    }

    if (!finalsize) finalsize = SFMAXFRAMES;
    if (framesinfile >= 0 && finalsize > (size_t)framesinfile)
        finalsize = framesinfile;

        /* no tablenames, try to use header info instead of reading */
    if (argc == 0 &&
        !(raw ||                     /* read if raw */
          finalsize == SFMAXFRAMES)) /* read if unknown size */
    {
        framesread = finalsize;
#ifdef DEBUG_SOUNDFILE
    post("skipped reading frames");
#endif
        goto done;
    }

        /* read */
#ifdef DEBUG_SOUNDFILE
    post("reading frames");
#endif
    bufframes = SAMPBUFSIZE / sf.sf_bytesperframe;
    for (framesread = 0; framesread < finalsize;)
    {
        size_t thisread = finalsize - framesread;
        thisread = (thisread > bufframes ? bufframes : thisread);
        nframes = read(sf.sf_fd, sampbuf,
            thisread * sf.sf_bytesperframe) / sf.sf_bytesperframe;
        if (nframes <= 0) break;
        soundfile_xferin_words(&sf, argc, vecs, framesread,
            (unsigned char *)sampbuf, nframes);
        framesread += nframes;
    }
        /* warn if a file's bad size field is gobbling memory */
    if (resize && framesread < (size_t)finalsize)
    {
        post("warning: soundfile %s header promised \
%ld points but file was truncated to %ld",
            filename, (long)finalsize, (long)framesread);
    }
        /* zero out remaining elements of vectors */
    for (i = 0; i < argc; i++)
    {
        int vecsize;
        if (garray_getfloatwords(garrays[i], &vecsize, &vecs[i]))
            for (j = framesread; j < (size_t)vecsize; j++)
                vecs[i][j].w_float = 0;
    }
        /* zero out vectors in excess of number of channels */
    for (i = sf.sf_nchannels; i < argc; i++)
    {
        int vecsize;
        t_word *foo;
        if (garray_getfloatwords(garrays[i], &vecsize, &foo))
            for (j = 0; j < (size_t)vecsize; j++)
                foo[j].w_float = 0;
    }
        /* do all graphics updates */
    for (i = 0; i < argc; i++)
        garray_redraw(garrays[i]);
    goto done;
usage:
    pd_error(x, "usage: read [flags] filename [tablename]...");
    post("flags: -skip <n> -resize -maxsize <n> %s -ascii ...", sf_typeargs);
    post("-raw <headerbytes> <channels> <bytespersample> "
         "<endian (b, l, or n)>");
done:
    sf.sf_fd = -1;
    if (fd >= 0)
        sys_close(fd);
    outlet_soundfileinfo(x->x_out2, &sf);
    outlet_float(x->x_obj.ob_outlet, (t_float)framesread);
}